

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O1

bool mjs::anon_unknown_35::anon_unknown_5::is_uri_unescaped(int ch)

{
  char *pcVar1;
  ulong uVar2;
  char cVar3;
  bool bVar4;
  
  bVar4 = true;
  if ((9 < ch - 0x30U) && (0x19 < (ch & 0xffffffdfU) - 0x41)) {
    uVar2 = 3;
    pcVar1 = "!~*\'()";
    do {
      cVar3 = (char)ch;
      if (pcVar1[-3] == cVar3) {
        pcVar1 = pcVar1 + -3;
        goto LAB_0013e342;
      }
      if (pcVar1[-2] == cVar3) {
        pcVar1 = pcVar1 + -2;
        goto LAB_0013e342;
      }
      if (pcVar1[-1] == cVar3) {
        pcVar1 = pcVar1 + -1;
        goto LAB_0013e342;
      }
      if (*pcVar1 == cVar3) goto LAB_0013e342;
      uVar2 = uVar2 - 1;
      pcVar1 = pcVar1 + 4;
    } while (1 < uVar2);
    pcVar1 = "-_.!~*\'()" + ((ulong)(cVar3 == ')') ^ 9);
LAB_0013e342:
    bVar4 = pcVar1 != "";
  }
  return bVar4;
}

Assistant:

constexpr bool is_alpha_or_digit(int ch) {
    return (ch >= 'A' && ch <= 'Z')
        || (ch >= 'a' && ch <= 'z')
        || (ch >= '0' && ch <= '9');
}